

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  unsigned_long_long uVar7;
  unsigned_long_long uVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  GetterXsYs<unsigned_long_long> *pGVar13;
  GetterXsYRef<unsigned_long_long> *pGVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  ImVec2 IVar17;
  ushort uVar18;
  bool bVar19;
  long lVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  float fVar27;
  double dVar28;
  ImVec2 IVar29;
  undefined1 auVar30 [16];
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  
  pGVar13 = this->Getter1;
  pGVar14 = this->Getter2;
  iVar11 = pGVar13->Count;
  lVar20 = (long)(((pGVar13->Offset + prim + 1) % iVar11 + iVar11) % iVar11) * (long)pGVar13->Stride
  ;
  uVar7 = *(unsigned_long_long *)((long)pGVar13->Xs + lVar20);
  uVar8 = *(unsigned_long_long *)((long)pGVar13->Ys + lVar20);
  auVar30._8_4_ = (int)(uVar8 >> 0x20);
  auVar30._0_8_ = uVar8;
  auVar30._12_4_ = 0x45300000;
  iVar11 = this->Transformer->YAxis;
  dVar26 = (double)GImPlot->PixelRange[iVar11].Min.x;
  dVar9 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar23 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar7 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) - dVar9) *
                   GImPlot->Mx + dVar26);
  dVar28 = (double)GImPlot->PixelRange[iVar11].Min.y;
  dVar10 = GImPlot->CurrentPlot->YAxis[iVar11].Range.Min;
  fVar25 = (float)((((auVar30._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) - dVar10) *
                   GImPlot->My[iVar11] + dVar28);
  iVar12 = pGVar14->Count;
  uVar7 = *(unsigned_long_long *)
           ((long)pGVar14->Xs +
           (long)(((prim + 1 + pGVar14->Offset) % iVar12 + iVar12) % iVar12) * (long)pGVar14->Stride
           );
  fVar32 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar7 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) - dVar9) *
                   GImPlot->Mx + dVar26);
  fVar33 = (float)((pGVar14->YRef - dVar10) * GImPlot->My[iVar11] + dVar28);
  fVar2 = (this->P11).x;
  fVar3 = (this->P12).x;
  fVar4 = (this->P11).y;
  fVar5 = (this->P12).y;
  fVar27 = fVar4;
  if (fVar5 <= fVar4) {
    fVar27 = fVar5;
  }
  if (fVar25 <= fVar27) {
    fVar27 = fVar25;
  }
  if (fVar33 <= fVar27) {
    fVar27 = fVar33;
  }
  bVar19 = false;
  if ((fVar27 < (cull_rect->Max).y) &&
     (fVar27 = (float)(~-(uint)(fVar5 <= fVar4) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar4) & (uint)fVar4), uVar22 = -(uint)(fVar25 <= fVar27),
     fVar27 = (float)(~uVar22 & (uint)fVar25 | uVar22 & (uint)fVar27),
     uVar22 = -(uint)(fVar33 <= fVar27),
     fVar27 = (float)(~uVar22 & (uint)fVar33 | uVar22 & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     bVar19 = false, *pfVar1 <= fVar27 && fVar27 != *pfVar1)) {
    fVar27 = fVar2;
    if (fVar3 <= fVar2) {
      fVar27 = fVar3;
    }
    if (fVar23 <= fVar27) {
      fVar27 = fVar23;
    }
    if (fVar32 <= fVar27) {
      fVar27 = fVar32;
    }
    if (fVar27 < (cull_rect->Max).x) {
      fVar27 = (float)(~-(uint)(fVar3 <= fVar2) & (uint)fVar3 |
                      -(uint)(fVar3 <= fVar2) & (uint)fVar2);
      uVar22 = -(uint)(fVar23 <= fVar27);
      fVar27 = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar27);
      uVar22 = -(uint)(fVar32 <= fVar27);
      fVar27 = (float)(~uVar22 & (uint)fVar32 | uVar22 & (uint)fVar27);
      bVar19 = (cull_rect->Min).x <= fVar27 && fVar27 != (cull_rect->Min).x;
    }
  }
  IVar29.y = fVar25;
  IVar29.x = fVar23;
  IVar31.y = fVar33;
  IVar31.x = fVar32;
  if (bVar19 != false) {
    fVar27 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar35 = fVar2 * fVar25 - fVar23 * fVar4;
    fVar34 = fVar3 * fVar33 - fVar32 * fVar5;
    fVar24 = (fVar2 - fVar23) * (fVar5 - fVar33) - (fVar3 - fVar32) * (fVar4 - fVar25);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = this->Col;
    pIVar15[1].pos = IVar29;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = this->Col;
    IVar17.y = ((fVar5 - fVar33) * fVar35 - (fVar4 - fVar25) * fVar34) / fVar24;
    IVar17.x = (fVar35 * (fVar3 - fVar32) - (fVar2 - fVar23) * fVar34) / fVar24;
    pIVar15[2].pos = IVar17;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = this->Col;
    pIVar15[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = this->Col;
    pIVar15[4].pos = IVar31;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar15 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar16 = IVar21;
    uVar18 = -(ushort)(fVar6 < fVar27 && fVar25 < fVar33 || fVar27 < fVar6 && fVar33 < fVar25) & 1;
    pIVar16[1] = IVar21 + uVar18 + 1;
    pIVar16[2] = IVar21 + 3;
    pIVar16[3] = IVar21 + 1;
    pIVar16[4] = (uVar18 ^ 3) + IVar21;
    pIVar16[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  this->P11 = IVar29;
  this->P12 = IVar31;
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }